

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_json_generator.cc
# Opt level: O2

void __thiscall
t_json_generator::write_const_value
          (t_json_generator *this,t_const_value *value,bool should_force_string)

{
  t_const_value_type tVar1;
  int64_t iVar2;
  map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
  map;
  vector<t_const_value_*,_std::allocator<t_const_value_*>_> list;
  
  tVar1 = t_const_value::get_type(value);
  switch(tVar1) {
  case CV_INTEGER:
  case CV_IDENTIFIER:
    if (!should_force_string) {
      iVar2 = t_const_value::get_integer(value);
      write_number<long>(this,iVar2);
      return;
    }
    iVar2 = t_const_value::get_integer(value);
    number_to_string<long>((string *)&map,this,iVar2);
    write_string(this,(string *)&map);
    break;
  case CV_DOUBLE:
    if (!should_force_string) {
      write_number<double>(this,value->doubleVal_);
      return;
    }
    number_to_string<double>((string *)&map,this,value->doubleVal_);
    write_string(this,(string *)&map);
    break;
  case CV_STRING:
    std::__cxx11::string::string((string *)&map,(string *)&value->stringVal_);
    write_string(this,(string *)&map);
    break;
  case CV_MAP:
    start_object(this,false);
    std::
    _Rb_tree<t_const_value_*,_std::pair<t_const_value_*const,_t_const_value_*>,_std::_Select1st<std::pair<t_const_value_*const,_t_const_value_*>_>,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
    ::_Rb_tree(&map._M_t,
               (_Rb_tree<t_const_value_*,_std::pair<t_const_value_*const,_t_const_value_*>,_std::_Select1st<std::pair<t_const_value_*const,_t_const_value_*>_>,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
                *)value);
    for (; (_Rb_tree_header *)map._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
           &map._M_t._M_impl.super__Rb_tree_header;
        map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             (_Base_ptr)
             std::_Rb_tree_increment(map._M_t._M_impl.super__Rb_tree_header._M_header._M_left)) {
      write_comma_if_needed(this);
      t_generator::indent_abi_cxx11_((string *)&list,&this->super_t_generator);
      std::operator<<((ostream *)&this->f_json_,(string *)&list);
      std::__cxx11::string::~string((string *)&list);
      write_const_value(this,*(t_const_value **)
                              (map._M_t._M_impl.super__Rb_tree_header._M_header._M_left + 1),true);
      std::operator<<((ostream *)&this->f_json_,": ");
      write_const_value(this,(t_const_value *)
                             map._M_t._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_parent,
                        false);
      indicate_comma_needed(this);
    }
    end_object(this);
    std::
    _Rb_tree<t_const_value_*,_std::pair<t_const_value_*const,_t_const_value_*>,_std::_Select1st<std::pair<t_const_value_*const,_t_const_value_*>_>,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
    ::~_Rb_tree(&map._M_t);
    return;
  case CV_LIST:
    start_array(this);
    std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>::vector(&list,&value->listVal_);
    for (; list.super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>._M_impl.
           super__Vector_impl_data._M_start !=
           list.super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
        list.super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>._M_impl.
        super__Vector_impl_data._M_start =
             list.super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>._M_impl.
             super__Vector_impl_data._M_start + 1) {
      write_comma_if_needed(this);
      t_generator::indent_abi_cxx11_((string *)&map,&this->super_t_generator);
      std::operator<<((ostream *)&this->f_json_,(string *)&map);
      std::__cxx11::string::~string((string *)&map);
      write_const_value(this,*list.
                              super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>.
                              _M_impl.super__Vector_impl_data._M_start,false);
      indicate_comma_needed(this);
    }
    end_array(this);
    std::_Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>::~_Vector_base
              (&list.super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>);
    return;
  default:
    std::operator<<((ostream *)&this->f_json_,"null");
    return;
  }
  std::__cxx11::string::~string((string *)&map);
  return;
}

Assistant:

void t_json_generator::write_const_value(t_const_value* value, bool should_force_string) {

  switch (value->get_type()) {

  case t_const_value::CV_IDENTIFIER:
  case t_const_value::CV_INTEGER:
    if (should_force_string) {
      write_string(number_to_string(value->get_integer()));
    } else {
      write_number(value->get_integer());
    }
    break;

  case t_const_value::CV_DOUBLE:
    if (should_force_string) {
      write_string(number_to_string(value->get_double()));
    } else {
      write_number(value->get_double());
    }
    break;

  case t_const_value::CV_STRING:
    write_string(value->get_string());
    break;

  case t_const_value::CV_LIST: {
    start_array();
    std::vector<t_const_value*> list = value->get_list();
    std::vector<t_const_value*>::iterator lit;
    for (lit = list.begin(); lit != list.end(); ++lit) {
      write_comma_if_needed();
      f_json_ << indent();
      write_const_value(*lit);
      indicate_comma_needed();
    }
    end_array();
    break;
  }

  case t_const_value::CV_MAP: {
    start_object(NO_INDENT);
    std::map<t_const_value*, t_const_value*, t_const_value::value_compare> map = value->get_map();
    std::map<t_const_value*, t_const_value*, t_const_value::value_compare>::iterator mit;
    for (mit = map.begin(); mit != map.end(); ++mit) {
      write_comma_if_needed();
      f_json_ << indent();
      // JSON objects only allow string keys
      write_const_value(mit->first, FORCE_STRING);
      f_json_ << ": ";
      write_const_value(mit->second);
      indicate_comma_needed();
    }
    end_object();
    break;
  }

  default:
    f_json_ << "null";
    break;
  }
}